

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_sign_with_k_internal
              (uint8_t *private_key,uint8_t *message_hash,uint hash_size,uECC_word_t *k,
              uint8_t *signature,uECC_Curve curve)

{
  uECC_word_t *left;
  char num_words;
  short sVar1;
  cmpresult_t cVar2;
  bitcount_t bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uECC_word_t uVar7;
  ulong uVar8;
  uECC_word_t *initial_Z;
  int iVar9;
  long lVar10;
  ulong uVar11;
  char num_words_00;
  uECC_word_t tmp [4];
  uECC_word_t *k2 [2];
  uECC_word_t s [4];
  uECC_word_t p [8];
  uECC_word_t local_e8 [4];
  uECC_word_t *local_c8 [4];
  uint8_t *local_a8;
  uint8_t *local_a0;
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  local_c8[0] = local_e8;
  local_c8[1] = local_98;
  num_words = curve->num_words;
  lVar10 = (long)num_words;
  sVar1 = curve->num_n_bits;
  iVar4 = sVar1 + 0x3f;
  iVar9 = sVar1 + 0x7e;
  if (-1 < iVar4) {
    iVar9 = iVar4;
  }
  if (lVar10 < 1) {
LAB_00106ab6:
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 | k[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
    if (uVar8 == 0) {
      return 0;
    }
    left = curve->n;
    num_words_00 = (char)(iVar9 >> 6);
    local_a8 = private_key;
    local_a0 = message_hash;
    cVar2 = uECC_vli_cmp(left,k,num_words_00);
    if (cVar2 != '\x01') {
      return 0;
    }
    uVar7 = regularize_k(k,local_e8,local_98,curve);
    if (g_rng_function == (uECC_RNG_Function)0x0) {
      initial_Z = (uECC_word_t *)0x0;
    }
    else {
      local_c8[3] = local_c8[uVar7];
      iVar4 = uECC_generate_random_int(local_c8[3],curve->p,num_words);
      initial_Z = local_c8[3];
      if (iVar4 == 0) goto LAB_00106ab6;
    }
    EccPoint_mult(local_78,curve->G,local_c8[uVar7 ^ 1],initial_Z,sVar1 + 1,curve);
    iVar4 = 0;
    if ('\0' < num_words) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 | local_78[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar10 != lVar6);
      if (uVar8 != 0) {
        if (g_rng_function == (uECC_RNG_Function)0x0) {
          if ('\0' < num_words_00) {
            memset(local_e8,0,(ulong)((iVar9 >> 6 & 0x7fU) << 3));
          }
          local_e8[0] = 1;
        }
        else {
          iVar4 = uECC_generate_random_int(local_e8,left,num_words_00);
          if (iVar4 == 0) {
            return 0;
          }
        }
        uECC_vli_modMult(k,k,local_e8,left,num_words_00);
        uECC_vli_modInv(k,k,left,num_words_00);
        uECC_vli_modMult(k,k,local_e8,left,num_words_00);
        uVar5 = (uint)curve->num_bytes;
        if ('\0' < curve->num_bytes) {
          uVar8 = (ulong)uVar5;
          iVar4 = uVar5 * 8;
          uVar11 = 0;
          do {
            iVar4 = iVar4 + -8;
            uVar5 = uVar5 - 1;
            signature[uVar11] =
                 (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar5 & 0xfffffff8)) >>
                          ((byte)iVar4 & 0x38));
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar8);
        }
        iVar4 = curve->num_n_bits + 7;
        iVar9 = curve->num_n_bits + 0xe;
        if (-1 < iVar4) {
          iVar9 = iVar4;
        }
        uECC_vli_bytesToNative(local_e8,local_a8,iVar9 >> 3);
        local_98[(long)num_words_00 + -1] = 0;
        if ('\0' < num_words) {
          memcpy(local_98,local_78,lVar10 << 3);
        }
        uECC_vli_modMult(local_98,local_e8,local_98,left,num_words_00);
        bits2int(local_e8,local_a0,hash_size,curve);
        uECC_vli_modAdd(local_98,local_e8,local_98,left,num_words_00);
        uECC_vli_modMult(local_98,local_98,k,left,num_words_00);
        bVar3 = uECC_vli_numBits(local_98,num_words_00);
        uVar5 = (uint)curve->num_bytes;
        iVar9 = uVar5 * 8;
        iVar4 = 0;
        if ((bVar3 <= iVar9) && (iVar4 = 1, '\0' < curve->num_bytes)) {
          lVar10 = (long)(int)uVar5;
          uVar8 = (ulong)uVar5;
          uVar11 = 0;
          do {
            uVar5 = uVar5 - 1;
            iVar9 = iVar9 + -8;
            signature[uVar11 + lVar10] =
                 (uint8_t)(*(ulong *)((long)local_98 + (ulong)(uVar5 & 0xfffffff8)) >>
                          ((byte)iVar9 & 0x38));
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar8);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int uECC_sign_with_k_internal(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            uECC_word_t *k,
                            uint8_t *signature,
                            uECC_Curve curve) {

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t s[uECC_MAX_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
    uECC_word_t *initial_Z = 0;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *p = (uECC_word_t *)signature;
#else
    uECC_word_t p[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;

    /* Make sure 0 < k < curve_n */
    if (uECC_vli_isZero(k, num_words) || uECC_vli_cmp(curve->n, k, num_n_words) != 1) {
        return 0;
    }

    carry = regularize_k(k, tmp, s, curve);
    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(k2[carry], curve->p, num_words)) {
            return 0;
        }
        initial_Z = k2[carry];
    }
    EccPoint_mult(p, curve->G, k2[!carry], initial_Z, num_n_bits + 1, curve);
    if (uECC_vli_isZero(p, num_words)) {
        return 0;
    }

    /* If an RNG function was specified, get a random number
       to prevent side channel analysis of k. */
    if (!g_rng_function) {
        uECC_vli_clear(tmp, num_n_words);
        tmp[0] = 1;
    } else if (!uECC_generate_random_int(tmp, curve->n, num_n_words)) {
        return 0;
    }

    /* Prevent side channel analysis of uECC_vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k' = rand * k */
    uECC_vli_modInv(k, k, curve->n, num_n_words);       /* k = 1 / k' */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k = 1 / k */

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(signature, curve->num_bytes, p); /* store r */
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) tmp, private_key, BITS_TO_BYTES(curve->num_n_bits));
#else
    uECC_vli_bytesToNative(tmp, private_key, BITS_TO_BYTES(curve->num_n_bits)); /* tmp = d */
#endif

    s[num_n_words - 1] = 0;
    uECC_vli_set(s, p, num_words);
    uECC_vli_modMult(s, tmp, s, curve->n, num_n_words); /* s = r*d */

    bits2int(tmp, message_hash, hash_size, curve);
    uECC_vli_modAdd(s, tmp, s, curve->n, num_n_words); /* s = e + r*d */
    uECC_vli_modMult(s, s, k, curve->n, num_n_words);  /* s = (e + r*d) / k */
    if (uECC_vli_numBits(s, num_n_words) > (bitcount_t)curve->num_bytes * 8) {
        return 0;
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) signature + curve->num_bytes, (uint8_t *) s, curve->num_bytes);
#else
    uECC_vli_nativeToBytes(signature + curve->num_bytes, curve->num_bytes, s);
#endif
    return 1;
}